

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O2

void __thiscall Sample::~Sample(Sample *this)

{
  al_destroy_sample(this->spl);
  std::__cxx11::string::~string((string *)&this->filename);
  return;
}

Assistant:

Sample::~Sample()
{
   al_destroy_sample(spl);
}